

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall
icu_63::SpoofData::SpoofData(SpoofData *this,void *data,int32_t length,UErrorCode *status)

{
  SpoofDataHeader *pSVar1;
  
  this->fRawData = (SpoofDataHeader *)0x0;
  this->fDataOwned = '\0';
  this->fUDM = (UDataMemory *)0x0;
  this->fMemLimit = 0;
  LOCK();
  (this->fRefCount).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  this->fCFUStrings = (UChar *)0x0;
  this->fCFUKeys = (int32_t *)0x0;
  this->fCFUValues = (uint16_t *)0x0;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (0x5f < (uint)length) {
    if (data == (void *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    this->fRawData = (SpoofDataHeader *)data;
    if (*(int *)((long)data + 8) <= length) {
      validateDataVersion(this,status);
      this->fCFUKeys = (int32_t *)0x0;
      this->fCFUValues = (uint16_t *)0x0;
      this->fCFUStrings = (UChar *)0x0;
      if (U_ZERO_ERROR < *status) {
        return;
      }
      pSVar1 = this->fRawData;
      if ((long)pSVar1->fCFUKeys != 0) {
        this->fCFUKeys = (int32_t *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUKeys + -4);
      }
      if ((long)pSVar1->fCFUStringIndex != 0) {
        this->fCFUValues = (uint16_t *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUStringIndex + -4)
        ;
      }
      if ((long)pSVar1->fCFUStringTable == 0) {
        return;
      }
      this->fCFUStrings = (UChar *)(pSVar1->fFormatVersion + (long)pSVar1->fCFUStringTable + -4);
      return;
    }
  }
  *status = U_INVALID_FORMAT_ERROR;
  return;
}

Assistant:

SpoofData::SpoofData(const void *data, int32_t length, UErrorCode &status)
{
    reset();
    if (U_FAILURE(status)) {
        return;
    }
    if ((size_t)length < sizeof(SpoofDataHeader)) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
    if (data == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    void *ncData = const_cast<void *>(data);
    fRawData = static_cast<SpoofDataHeader *>(ncData);
    if (length < fRawData->fLength) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
    validateDataVersion(status);
    initPtrs(status);
}